

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

void resolv_worker(void *index)

{
  int iVar1;
  nni_aio *pnVar2;
  int *piVar3;
  void *pvVar4;
  char *pcVar5;
  int iVar6;
  nng_err result;
  addrinfo *paVar7;
  char local_188 [8];
  char host [256];
  char local_80 [8];
  char serv [8];
  addrinfo hints;
  addrinfo *local_38;
  addrinfo *results;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:resolver");
  nni_mtx_lock(&resolv_mtx);
  iVar6 = (int)index;
LAB_0011a1da:
  do {
    while (pnVar2 = (nni_aio *)nni_list_first(&resolv_aios), pnVar2 == (nni_aio *)0x0) {
      if (resolv_fini != '\0') {
        nni_mtx_unlock(&resolv_mtx);
        return;
      }
      nni_cv_wait(&resolv_cv);
    }
    piVar3 = (int *)nni_aio_get_prov_data(pnVar2);
    nni_aio_list_remove(pnVar2);
    resolv_active[iVar6] = pnVar2;
    pcVar5 = *(char **)(piVar3 + 2);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    snprintf(local_188,0x100,"%s",pcVar5);
    snprintf(local_80,8,"%u",(ulong)*(ushort *)(piVar3 + 4));
    serv[0] = '\0';
    serv[1] = '\0';
    serv[2] = '\0';
    serv[3] = '\0';
    serv[4] = '\0';
    serv[5] = '\0';
    serv[6] = '\0';
    serv[7] = '\0';
    local_38 = (addrinfo *)0x0;
    iVar1 = *piVar3;
    if (iVar1 == 0) {
      serv[4] = '\0';
      serv[5] = '\0';
      serv[6] = '\0';
      serv[7] = '\0';
    }
    else if (iVar1 == 4) {
      serv[4] = '\n';
      serv[5] = '\0';
      serv[6] = '\0';
      serv[7] = '\0';
    }
    else {
      if (iVar1 != 3) {
        resolv_active[iVar6] = (nni_aio *)0x0;
        nni_aio_finish_error(pnVar2,NNG_ENOTSUP);
        goto LAB_0011a1da;
      }
      serv[4] = '\x02';
      serv[5] = '\0';
      serv[6] = '\0';
      serv[7] = '\0';
    }
    serv = (char  [8])(CONCAT44(serv._4_4_,(uint)*(byte *)(piVar3 + 1)) | 0x420);
    nni_mtx_unlock(&resolv_mtx);
    pcVar5 = local_188;
    if (local_188[0] == '\0') {
      pcVar5 = (char *)0x0;
    }
    iVar1 = getaddrinfo(pcVar5,local_80,(addrinfo *)serv,&local_38);
    nni_mtx_lock(&resolv_mtx);
    pnVar2 = resolv_active[iVar6];
    if (pnVar2 == (nni_aio *)0x0) {
      if (iVar1 == 0) {
LAB_0011a34c:
        freeaddrinfo(local_38);
      }
    }
    else {
      resolv_active[iVar6] = (nni_aio *)0x0;
      switch(iVar1) {
      case 0:
        for (paVar7 = local_38; paVar7 != (addrinfo *)0x0; paVar7 = paVar7->ai_next) {
          if ((paVar7->ai_addr->sa_family | 8) == 10) {
            pvVar4 = nni_aio_get_prov_data(pnVar2);
            nni_aio_set_prov_data(pnVar2,(void *)0x0);
            if (pvVar4 == (void *)0x0) {
              nni_panic("%s: %d: assert err: %s",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_resolv_gai.c"
                        ,0x115,"item != NULL");
            }
            nni_posix_sockaddr2nn
                      (*(nni_sockaddr **)((long)pvVar4 + 0x18),paVar7->ai_addr,
                       (ulong)paVar7->ai_addrlen);
            freeaddrinfo(local_38);
            nni_aio_finish(pnVar2,NNG_OK,0);
            goto LAB_0011a1da;
          }
        }
        nni_aio_finish_error(pnVar2,NNG_EADDRINVAL);
        goto LAB_0011a34c;
      case -0xb:
        piVar3 = __errno_location();
        result = nni_plat_errno(*piVar3);
        break;
      case -10:
        result = NNG_ENOMEM;
        break;
      case -9:
      case -6:
      case -4:
switchD_0011a338_caseD_fffffff7:
        result = iVar1 + NNG_ESYSERR;
        break;
      case -8:
      case -5:
      case -2:
        result = NNG_EADDRINVAL;
        break;
      case -7:
        result = NNG_ENOTSUP;
        break;
      case -3:
        result = NNG_EAGAIN;
        break;
      case -1:
        result = NNG_EINVAL;
        break;
      default:
        if (iVar1 != -0x65) goto switchD_0011a338_caseD_fffffff7;
        result = NNG_ECANCELED;
      }
      nni_aio_finish_error(pnVar2,result);
    }
  } while( true );
}

Assistant:

void
resolv_worker(void *index)
{
	int              tid = (int) (intptr_t) index;
	struct addrinfo  hints;
	struct addrinfo *results;
	struct addrinfo *probe;
	int              rv;
	char             serv[8];
	char             host[256];
	nni_aio         *aio;
	nni_resolv_item *item;

	nni_thr_set_name(NULL, "nng:resolver");

	nni_mtx_lock(&resolv_mtx);
	for (;;) {

		if ((aio = nni_list_first(&resolv_aios)) == NULL) {
			if (resolv_fini) {
				break;
			}
			nni_cv_wait(&resolv_cv);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_list_remove(aio);
		resolv_active[tid] = aio;

		snprintf(host, sizeof(host), "%s",
		    item->ri_host ? item->ri_host : "");
		snprintf(serv, sizeof(serv), "%u", item->ri_port);

		// We treat these all as IP addresses.  The service and the
		// host part are split.
		memset(&hints, 0, sizeof(hints));

		results = NULL;

		switch (item->ri_family) {
		case NNG_AF_INET:
			hints.ai_family = AF_INET;
			break;

#ifdef NNG_ENABLE_IPV6
		case NNG_AF_INET6:
			hints.ai_family = AF_INET6;
			break;
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_UNSPEC;
			break;
#else
		case NNG_AF_UNSPEC:
			hints.ai_family = AF_INET;
			break;
#endif
		default:
			resolv_active[tid] = NULL;
			nni_aio_finish_error(aio, NNG_ENOTSUP);
			continue;
		}

#ifdef AI_ADDRCONFIG
		hints.ai_flags = AI_ADDRCONFIG;
#endif
		if (item->ri_passive) {
			hints.ai_flags |= AI_PASSIVE;
		}
		hints.ai_socktype = SOCK_STREAM;
		hints.ai_flags |= AI_NUMERICSERV;

		// We can pass any non-zero service number, but we have to pass
		// *something*, in case we are using a NULL hostname.  The lock
		// is dropped to allow other submissions, and other threads to
		// process.
		nni_mtx_unlock(&resolv_mtx);
		rv = getaddrinfo(
		    host[0] != 0 ? host : NULL, serv, &hints, &results);
		nni_mtx_lock(&resolv_mtx);

		if ((aio = resolv_active[tid]) == NULL) {
			// no more interest (canceled), so ignore the result
			// and carry on
			if (rv == 0) {
				freeaddrinfo(results);
			}
			continue;
		}
		resolv_active[tid] = NULL;

		if (rv != 0) {
			rv = posix_gai_errno(rv);
			nni_aio_finish_error(aio, rv);
			continue;
		}

		// We only take the first matching address.  Presumably
		// DNS load balancing is done by the resolver/server.

		for (probe = results; probe != NULL; probe = probe->ai_next) {
			if (probe->ai_addr->sa_family == AF_INET) {
				break;
			}
#ifdef NNG_ENABLE_IPV6
			if (probe->ai_addr->sa_family == AF_INET6) {
				break;
			}
#endif
		}

		if (probe == NULL) {
			// no match
			nni_aio_finish_error(aio, NNG_EADDRINVAL);
			freeaddrinfo(results);
			continue;
		}

		item = nni_aio_get_prov_data(aio);
		nni_aio_set_prov_data(aio, NULL);
		NNI_ASSERT(item != NULL);

		(void) nni_posix_sockaddr2nn(
		    item->ri_sa, probe->ai_addr, probe->ai_addrlen);

		freeaddrinfo(results);
		nni_aio_finish(aio, 0, 0);
	}
	nni_mtx_unlock(&resolv_mtx);
}